

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

int __thiscall QMessageBoxPrivate::execReturnCode(QMessageBoxPrivate *this,QAbstractButton *button)

{
  StandardButton SVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QAbstractButton *button_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  button_local = button;
  SVar1 = QDialogButtonBox::standardButton((QDialogButtonBox *)this->buttonBox,button);
  if (SVar1 == NoButton) {
    qVar2 = QtPrivate::indexOf<QAbstractButton*,QAbstractButton*>
                      (&this->customButtonList,&button_local,0);
    SVar1 = (StandardButton)qVar2 + 2;
    if (qVar2 < 0) {
      SVar1 = (StandardButton)qVar2;
    }
  }
  else if (this->compatMode == true) {
    SVar1 = SVar1 & 0xfffffcff;
    if (SVar1 == FirstButton) {
      SVar1 = 1;
    }
    else if (SVar1 == Yes) {
      SVar1 = 3;
    }
    else if (SVar1 == YesToAll) {
      SVar1 = 8;
    }
    else if (SVar1 == No) {
      SVar1 = 4;
    }
    else if (SVar1 == NoToAll) {
      SVar1 = 9;
    }
    else if (SVar1 == Abort) {
      SVar1 = 5;
    }
    else if (SVar1 == Retry) {
      SVar1 = 6;
    }
    else if (SVar1 == Ignore) {
      SVar1 = 7;
    }
    else if (SVar1 == Cancel) {
      SVar1 = 2;
    }
    else {
      SVar1 = NoButton;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return SVar1;
}

Assistant:

int QMessageBoxPrivate::execReturnCode(QAbstractButton *button)
{
    if (int standardButton = buttonBox->standardButton(button)) {
        // When using a QMessageBox with standard buttons, the return
        // code is a StandardButton value indicating the standard button
        // that was clicked.
        if (compatMode)
            return oldButton(standardButton);
        else
            return standardButton;
    } else {
        // When using QMessageBox with custom buttons, the return code
        // is an opaque value, and the user is expected to use clickedButton()
        // to determine which button was clicked. We make sure to keep the opaque
        // value out of the QDialog::DialogCode range, so we can distinguish them.
        auto customButtonIndex = customButtonList.indexOf(button);
        if (customButtonIndex >= 0)
            return QDialog::DialogCode::Accepted + customButtonIndex + 1;
        else
            return customButtonIndex; // Not found, return -1
    }
}